

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void __thiscall google::LogMessageTime::LogMessageTime(LogMessageTime *this,time_point now)

{
  time_t timestamp;
  tm tm;
  long local_88;
  tm local_80 [2];
  
  (this->tm_).tm_mon = 0;
  (this->tm_).tm_year = 0;
  (this->tm_).tm_wday = 0;
  (this->tm_).tm_yday = 0;
  (this->tm_).tm_sec = 0;
  (this->tm_).tm_min = 0;
  (this->tm_).tm_hour = 0;
  (this->tm_).tm_mday = 0;
  (this->tm_).tm_isdst = 0;
  (this->tm_).tm_gmtoff = 0;
  (this->tm_).tm_zone = (char *)0x0;
  (this->timestamp_).__d.__r = (rep)now.__d.__r;
  local_88 = (long)now.__d.__r / 1000000000;
  if (fLB::FLAGS_log_utc_time == '\x01') {
    gmtime_r(&local_88,local_80);
  }
  else {
    localtime_r(&local_88,local_80);
  }
  (this->tm_).tm_zone = local_80[0].tm_zone;
  (this->tm_).tm_isdst = local_80[0].tm_isdst;
  *(undefined4 *)&(this->tm_).field_0x24 = local_80[0]._36_4_;
  (this->tm_).tm_gmtoff = local_80[0].tm_gmtoff;
  (this->tm_).tm_mon = local_80[0].tm_mon;
  (this->tm_).tm_year = local_80[0].tm_year;
  (this->tm_).tm_wday = local_80[0].tm_wday;
  (this->tm_).tm_yday = local_80[0].tm_yday;
  (this->tm_).tm_sec = local_80[0].tm_sec;
  (this->tm_).tm_min = local_80[0].tm_min;
  (this->tm_).tm_hour = local_80[0].tm_hour;
  (this->tm_).tm_mday = local_80[0].tm_mday;
  (this->gmtoffset_).__r = (local_80[0].tm_gmtoff / 0xe10) * 0xe10;
  (this->usecs_).__r = (local_88 * -1000000000 + (long)now.__d.__r) / 1000;
  return;
}

Assistant:

LogMessageTime::LogMessageTime(std::chrono::system_clock::time_point now)
    : timestamp_{now} {
  std::time_t timestamp;
  std::tie(tm_, timestamp, gmtoffset_) = Breakdown(now);
  usecs_ = std::chrono::duration_cast<std::chrono::microseconds>(
      now - std::chrono::system_clock::from_time_t(timestamp));
}